

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  byte bVar1;
  long in_RSI;
  stbi__context *in_RDI;
  int i;
  stbi__context *in_stack_ffffffffffffffd8;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*(char *)(in_RSI + local_1c) == '\0') {
      stbi__rewind(in_RDI);
      return 1;
    }
    bVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    if ((uint)bVar1 != (int)*(char *)(in_RSI + local_1c)) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}